

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastq_parser.hpp
# Opt level: O0

vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
* __thiscall
bioparser::FastqParser<biosoup::Sequence>::Parse
          (vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
           *__return_storage_ptr__,FastqParser<biosoup::Sequence> *this,uint64_t bytes,
          bool shorten_names)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  vector<char,_std::allocator<char>_> *this_00;
  const_reference pvVar6;
  value_type c;
  uint local_84;
  uint32_t buffer_ptr;
  undefined1 auStack_78 [3];
  bool is_quality;
  bool is_comment;
  bool is_data;
  bool is_name;
  bool is_eof;
  anon_class_56_7_9b2cff2a create_T;
  uint32_t local_38;
  uint32_t quality_ptr;
  uint32_t comment_ptr;
  uint32_t data_ptr;
  uint64_t parsed_bytes;
  pointer puStack_20;
  bool shorten_names_local;
  uint64_t bytes_local;
  FastqParser<biosoup::Sequence> *this_local;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  *dst;
  
  parsed_bytes._6_1_ = 0;
  parsed_bytes._7_1_ = shorten_names;
  puStack_20 = (pointer)bytes;
  bytes_local = (uint64_t)this;
  this_local = (FastqParser<biosoup::Sequence> *)__return_storage_ptr__;
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::vector(__return_storage_ptr__);
  _comment_ptr = (pointer)0x0;
  quality_ptr = 0;
  local_38 = 0;
  create_T.parsed_bytes._4_4_ = 0;
  _auStack_78 = &quality_ptr;
  create_T.data_ptr = &local_38;
  create_T.comment_ptr = (uint32_t *)((long)&create_T.parsed_bytes + 4);
  create_T.quality_ptr = (uint32_t *)((long)&parsed_bytes + 7);
  create_T.dst = (vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                  *)&comment_ptr;
  buffer_ptr._3_1_ = false;
  bVar1 = 1;
  bVar4 = false;
  bVar2 = false;
  bVar3 = false;
  create_T.shorten_names = (bool *)this;
  create_T.this = (FastqParser<biosoup::Sequence> *)__return_storage_ptr__;
  while( true ) {
    for (local_84 = Parser<biosoup::Sequence>::buffer_ptr(&this->super_Parser<biosoup::Sequence>);
        uVar5 = Parser<biosoup::Sequence>::buffer_bytes(&this->super_Parser<biosoup::Sequence>),
        local_84 < uVar5; local_84 = local_84 + 1) {
      this_00 = Parser<biosoup::Sequence>::buffer(&this->super_Parser<biosoup::Sequence>);
      pvVar6 = std::vector<char,_std::allocator<char>_>::operator[](this_00,(ulong)local_84);
      if (*pvVar6 == '\n') {
        uVar5 = Parser<biosoup::Sequence>::buffer_ptr(&this->super_Parser<biosoup::Sequence>);
        Parser<biosoup::Sequence>::Store
                  (&this->super_Parser<biosoup::Sequence>,(ulong)(local_84 - uVar5),(bool)~bVar1);
        if (bVar1 == 0) {
          if (bVar2) {
            bVar2 = false;
            bVar3 = true;
            create_T.parsed_bytes._4_4_ =
                 Parser<biosoup::Sequence>::storage_ptr(&this->super_Parser<biosoup::Sequence>);
          }
          else if ((bVar3) &&
                  (uVar5 = Parser<biosoup::Sequence>::storage_ptr
                                     (&this->super_Parser<biosoup::Sequence>),
                  local_38 - quality_ptr <= uVar5 - create_T.parsed_bytes._4_4_)) {
            bVar3 = false;
            bVar1 = 1;
            Parse::anon_class_56_7_9b2cff2a::operator()((anon_class_56_7_9b2cff2a *)auStack_78);
            if (puStack_20 <= _comment_ptr) {
              return __return_storage_ptr__;
            }
          }
        }
        else {
          bVar1 = 0;
          bVar4 = true;
          quality_ptr = Parser<biosoup::Sequence>::storage_ptr
                                  (&this->super_Parser<biosoup::Sequence>);
        }
      }
      else if ((bVar4) && (*pvVar6 == '+')) {
        bVar4 = false;
        bVar2 = true;
        local_38 = Parser<biosoup::Sequence>::storage_ptr(&this->super_Parser<biosoup::Sequence>);
      }
    }
    uVar5 = Parser<biosoup::Sequence>::buffer_ptr(&this->super_Parser<biosoup::Sequence>);
    if (uVar5 < local_84) {
      uVar5 = Parser<biosoup::Sequence>::buffer_ptr(&this->super_Parser<biosoup::Sequence>);
      Parser<biosoup::Sequence>::Store
                (&this->super_Parser<biosoup::Sequence>,(ulong)(local_84 - uVar5),(bool)~bVar1);
    }
    if (buffer_ptr._3_1_ != false) break;
    buffer_ptr._3_1_ = Parser<biosoup::Sequence>::Read(&this->super_Parser<biosoup::Sequence>);
  }
  uVar5 = Parser<biosoup::Sequence>::storage_ptr(&this->super_Parser<biosoup::Sequence>);
  if (uVar5 != 0) {
    Parse::anon_class_56_7_9b2cff2a::operator()((anon_class_56_7_9b2cff2a *)auStack_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<T>> Parse(
      std::uint64_t bytes, bool shorten_names = true) override {
    std::vector<std::unique_ptr<T>> dst;
    std::uint64_t parsed_bytes = 0;
    std::uint32_t data_ptr = 0;
    std::uint32_t comment_ptr = 0;
    std::uint32_t quality_ptr = 0;

    auto create_T = [&] () -> void {
      if (data_ptr == 0 || comment_ptr == 0 || quality_ptr == 0) {
        throw std::invalid_argument(
            "[bioparser::FastqParser] error: invalid file format");
      }

      auto name_len = shorten_names ?
          this->Shorten(this->storage().data(), data_ptr) :
          this->RightStrip(this->storage().data(), data_ptr);

      auto data_len = comment_ptr - data_ptr;

      auto quality_len = this->storage_ptr() - quality_ptr;

      if (name_len == 0 || this->storage()[0] != '@' || data_len == 0 ||
          quality_len == 0 || data_len != quality_len) {
        throw std::invalid_argument(
            "[bioparser::FastqParser] error: invalid file format");
      }

      dst.emplace_back(std::unique_ptr<T>(new T(
          static_cast<const char*>(this->storage().data() + 1), name_len - 1,
          static_cast<const char*>(this->storage().data() + data_ptr), data_len,
          static_cast<const char*>(this->storage().data() + quality_ptr), quality_len)));  // NOLINT

      parsed_bytes += this->storage_ptr();
      data_ptr = 0;
      comment_ptr = 0;
      quality_ptr = 0;
      this->Clear();
    };

    bool is_eof = false;
    bool is_name = true;
    bool is_data = false;
    bool is_comment = false;
    bool is_quality = false;

    while (true) {
      auto buffer_ptr = this->buffer_ptr();
      for (; buffer_ptr < this->buffer_bytes(); ++buffer_ptr) {
        auto c = this->buffer()[buffer_ptr];
        if (c == '\n') {
          this->Store(buffer_ptr - this->buffer_ptr(), !is_name);
          if (is_name) {
            is_name = false;
            is_data = true;
            data_ptr = this->storage_ptr();
          } else if (is_comment) {
            is_comment = false;
            is_quality = true;
            quality_ptr = this->storage_ptr();
          } else if (is_quality &&
                this->storage_ptr() - quality_ptr >= comment_ptr - data_ptr) {
            is_quality = false;
            is_name = true;
            create_T();
            if (parsed_bytes >= bytes) {
              return dst;
            }
          }
        } else if (is_data && c == '+') {
          is_data = false;
          is_comment = true;
          comment_ptr = this->storage_ptr();
        }
      }
      if (this->buffer_ptr() < buffer_ptr) {
        this->Store(buffer_ptr - this->buffer_ptr(), !is_name);
      }

      if (is_eof) {
        break;
      }
      is_eof = this->Read();
    }

    if (this->storage_ptr() != 0) {
      create_T();
    }

    return dst;
  }